

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O1

void __thiscall RTQuaternion::normalize(RTQuaternion *this)

{
  float fVar1;
  float fVar2;
  
  fVar2 = this->m_data[3] * this->m_data[3] +
          this->m_data[2] * this->m_data[2] +
          this->m_data[0] * this->m_data[0] + this->m_data[1] * this->m_data[1];
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  if (((fVar2 != 0.0) || (NAN(fVar2))) && ((fVar2 != 1.0 || (NAN(fVar2))))) {
    fVar1 = this->m_data[1];
    this->m_data[0] = this->m_data[0] / fVar2;
    this->m_data[1] = fVar1 / fVar2;
    this->m_data[2] = this->m_data[2] / fVar2;
    this->m_data[3] = this->m_data[3] / fVar2;
  }
  return;
}

Assistant:

void RTQuaternion::normalize()
{
    RTFLOAT length = sqrt(m_data[0] * m_data[0] + m_data[1] * m_data[1] +
            m_data[2] * m_data[2] + m_data[3] * m_data[3]);

    if ((length == 0) || (length == 1))
        return;

    m_data[0] /= length;
    m_data[1] /= length;
    m_data[2] /= length;
    m_data[3] /= length;
}